

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.hpp
# Opt level: O3

void __thiscall
boost::unit_test::framework::internal_error::internal_error(internal_error *this,const_string *m)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,m->m_begin,m->m_end);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  *(undefined ***)this = &PTR__runtime_error_001c9bc8;
  return;
}

Assistant:

internal_error( const_string m ) : std::runtime_error( std::string( m.begin(), m.size() ) ) {}